

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlCtxtUseOptions(htmlParserCtxtPtr ctxt,int options)

{
  uint local_1c;
  int options_local;
  htmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    ctxt_local._4_4_ = 0xffffffff;
  }
  else {
    local_1c = options;
    if ((options & 0x40U) != 0) {
      ctxt->sax->warning = (warningSAXFunc)0x0;
      (ctxt->vctxt).warning = (xmlValidityWarningFunc)0x0;
      local_1c = options - 0x40;
      ctxt->options = ctxt->options | 0x40;
    }
    if ((local_1c & 0x20) != 0) {
      ctxt->sax->error = (errorSAXFunc)0x0;
      (ctxt->vctxt).error = (xmlValidityErrorFunc)0x0;
      ctxt->sax->fatalError = (fatalErrorSAXFunc)0x0;
      local_1c = local_1c - 0x20;
      ctxt->options = ctxt->options | 0x20;
    }
    if ((local_1c & 0x80) == 0) {
      ctxt->pedantic = 0;
    }
    else {
      ctxt->pedantic = 1;
      local_1c = local_1c - 0x80;
      ctxt->options = ctxt->options | 0x80;
    }
    if ((local_1c & 0x100) == 0) {
      ctxt->keepBlanks = 1;
    }
    else {
      ctxt->keepBlanks = 0;
      ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
      local_1c = local_1c - 0x100;
      ctxt->options = ctxt->options | 0x100;
    }
    if ((local_1c & 1) == 0) {
      ctxt->recovery = 0;
    }
    else {
      ctxt->recovery = 1;
      local_1c = local_1c - 1;
    }
    if ((local_1c & 0x10000) != 0) {
      ctxt->options = ctxt->options | 0x10000;
      local_1c = local_1c - 0x10000;
    }
    if ((local_1c & 0x80000) != 0) {
      ctxt->options = ctxt->options | 0x80000;
      local_1c = local_1c - 0x80000;
    }
    if ((local_1c & 4) != 0) {
      ctxt->options = ctxt->options | 4;
      local_1c = local_1c - 4;
    }
    if ((local_1c & 0x200000) != 0) {
      ctxt->options = ctxt->options | 0x200000;
      local_1c = local_1c - 0x200000;
    }
    if ((local_1c & 0x2000) != 0) {
      ctxt->options = ctxt->options | 0x2000;
      local_1c = local_1c - 0x2000;
    }
    ctxt->dictNames = 0;
    ctxt_local._4_4_ = local_1c;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
htmlCtxtUseOptions(htmlParserCtxtPtr ctxt, int options)
{
    if (ctxt == NULL)
        return(-1);

    if (options & HTML_PARSE_NOWARNING) {
        ctxt->sax->warning = NULL;
        ctxt->vctxt.warning = NULL;
        options -= XML_PARSE_NOWARNING;
	ctxt->options |= XML_PARSE_NOWARNING;
    }
    if (options & HTML_PARSE_NOERROR) {
        ctxt->sax->error = NULL;
        ctxt->vctxt.error = NULL;
        ctxt->sax->fatalError = NULL;
        options -= XML_PARSE_NOERROR;
	ctxt->options |= XML_PARSE_NOERROR;
    }
    if (options & HTML_PARSE_PEDANTIC) {
        ctxt->pedantic = 1;
        options -= XML_PARSE_PEDANTIC;
	ctxt->options |= XML_PARSE_PEDANTIC;
    } else
        ctxt->pedantic = 0;
    if (options & XML_PARSE_NOBLANKS) {
        ctxt->keepBlanks = 0;
        ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
        options -= XML_PARSE_NOBLANKS;
	ctxt->options |= XML_PARSE_NOBLANKS;
    } else
        ctxt->keepBlanks = 1;
    if (options & HTML_PARSE_RECOVER) {
        ctxt->recovery = 1;
	options -= HTML_PARSE_RECOVER;
    } else
        ctxt->recovery = 0;
    if (options & HTML_PARSE_COMPACT) {
	ctxt->options |= HTML_PARSE_COMPACT;
        options -= HTML_PARSE_COMPACT;
    }
    if (options & XML_PARSE_HUGE) {
	ctxt->options |= XML_PARSE_HUGE;
        options -= XML_PARSE_HUGE;
    }
    if (options & HTML_PARSE_NODEFDTD) {
	ctxt->options |= HTML_PARSE_NODEFDTD;
        options -= HTML_PARSE_NODEFDTD;
    }
    if (options & HTML_PARSE_IGNORE_ENC) {
	ctxt->options |= HTML_PARSE_IGNORE_ENC;
        options -= HTML_PARSE_IGNORE_ENC;
    }
    if (options & HTML_PARSE_NOIMPLIED) {
        ctxt->options |= HTML_PARSE_NOIMPLIED;
        options -= HTML_PARSE_NOIMPLIED;
    }
    ctxt->dictNames = 0;
    return (options);
}